

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_rect.cpp
# Opt level: O2

bool __thiscall CUIRect::Inside(CUIRect *this,float x,float y)

{
  if (((this->x <= x) && (x < this->x + this->w)) && (this->y <= y)) {
    return y < this->y + this->h;
  }
  return false;
}

Assistant:

bool CUIRect::Inside(float x, float y) const
{
	return x >= this->x
		&& x < this->x + this->w
		&& y >= this->y
		&& y < this->y + this->h;
}